

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproperty.cpp
# Opt level: O0

void QtPrivate::BindableWarnings::printUnsuitableBindableWarning
               (QAnyStringView prefix,Reason reason)

{
  bool bVar1;
  QDebug *t;
  int in_EDX;
  long in_FS_OFFSET;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  QLoggingCategory *in_stack_fffffffffffffe78;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *in_stack_fffffffffffffe80;
  QString *in_stack_fffffffffffffe88;
  QString *t_00;
  QMessageLogger *in_stack_fffffffffffffe90;
  QMessageLogger *in_stack_fffffffffffffe98;
  QDebug *in_stack_fffffffffffffea8;
  QDebug *pQVar2;
  QDebug *in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed8;
  QString local_f0;
  QMessageLogger local_d0;
  QDebug local_b0 [4];
  QDebug local_90 [4];
  QDebug local_70 [4];
  QDebug local_50 [3];
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_EDX != 0) {
    if (in_EDX == 1) {
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      lcQPropertyBinding();
      anon_unknown.dwarf_71fbad::QLoggingCategoryMacroHolder<(QtMsgType)1>::
      QLoggingCategoryMacroHolder(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
        anon_unknown.dwarf_71fbad::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x415cd5);
        pQVar2 = local_70;
        QMessageLogger::QMessageLogger
                  (in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88,
                   (int)((ulong)in_stack_fffffffffffffe80 >> 0x20),(char *)in_stack_fffffffffffffe78
                   ,(char *)0x415cf1);
        QMessageLogger::warning(in_stack_fffffffffffffe98);
        t = QDebug::noquote(local_50);
        QAnyStringView::toString((QAnyStringView *)in_stack_fffffffffffffe80);
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
        QDebug::operator<<(in_stack_fffffffffffffea8,(char *)t);
        QString::~QString((QString *)0x415d69);
        QDebug::~QDebug(pQVar2);
        local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
      }
      goto LAB_00416065;
    }
    if (in_EDX == 2) {
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      lcQPropertyBinding();
      anon_unknown.dwarf_71fbad::QLoggingCategoryMacroHolder<(QtMsgType)1>::
      QLoggingCategoryMacroHolder(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_28), bVar1) {
        anon_unknown.dwarf_71fbad::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x415e23);
        pQVar2 = local_b0;
        QMessageLogger::QMessageLogger
                  (in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88,
                   (int)((ulong)in_stack_fffffffffffffe80 >> 0x20),(char *)in_stack_fffffffffffffe78
                   ,(char *)0x415e3f);
        QMessageLogger::warning(in_stack_fffffffffffffe98);
        QDebug::noquote(local_90);
        QAnyStringView::toString((QAnyStringView *)in_stack_fffffffffffffe80);
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
        QDebug::operator<<(pQVar2,in_stack_fffffffffffffed8);
        QString::~QString((QString *)0x415eb7);
        QDebug::~QDebug(in_stack_fffffffffffffec8);
        local_20 = (undefined1 *)((ulong)local_20 & 0xffffffffffffff00);
      }
      goto LAB_00416065;
    }
  }
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  lcQPropertyBinding();
  anon_unknown.dwarf_71fbad::QLoggingCategoryMacroHolder<(QtMsgType)1>::QLoggingCategoryMacroHolder
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_38), bVar1) {
    anon_unknown.dwarf_71fbad::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x415f73);
    t_00 = &local_f0;
    QMessageLogger::QMessageLogger
              (in_stack_fffffffffffffe90,(char *)t_00,
               (int)((ulong)in_stack_fffffffffffffe80 >> 0x20),(char *)in_stack_fffffffffffffe78,
               (char *)0x415f8f);
    in_stack_fffffffffffffe90 = &local_d0;
    QMessageLogger::warning(in_stack_fffffffffffffe98);
    in_stack_fffffffffffffe98 =
         (QMessageLogger *)QDebug::noquote((QDebug *)in_stack_fffffffffffffe90);
    QAnyStringView::toString((QAnyStringView *)in_stack_fffffffffffffe80);
    in_stack_fffffffffffffe80 =
         (QLoggingCategoryMacroHolder<(QtMsgType)1> *)
         QDebug::operator<<((QDebug *)in_stack_fffffffffffffe90,t_00);
    QDebug::operator<<(in_stack_fffffffffffffea8,in_stack_fffffffffffffed8);
    QString::~QString((QString *)0x416007);
    QDebug::~QDebug(in_stack_fffffffffffffec8);
    local_30 = (undefined1 *)((ulong)local_30 & 0xffffffffffffff00);
  }
LAB_00416065:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void printUnsuitableBindableWarning(QAnyStringView prefix, BindableWarnings::Reason reason)
{
    switch (reason) {
    case QtPrivate::BindableWarnings::NonBindableInterface:
        qCWarning(lcQPropertyBinding).noquote() << prefix.toString()
                                                << "The QBindable does not allow interaction with the binding.";
        break;
    case QtPrivate::BindableWarnings::ReadOnlyInterface:
        qCWarning(lcQPropertyBinding).noquote() << prefix.toString()
                                                << "The QBindable is read-only.";
        break;
    default:
    case QtPrivate::BindableWarnings::InvalidInterface:
        qCWarning(lcQPropertyBinding).noquote() << prefix.toString()
                                                << "The QBindable is invalid.";
        break;
    }
}